

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * QUnicodeTables::convertCase<QString>
                    (QString *__return_storage_ptr__,QString *str,Case which)

{
  QStringIterator it;
  long lVar1;
  char32_t ucs4;
  Properties *pPVar2;
  long lVar3;
  long in_FS_OFFSET;
  QStringIterator local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.i = (const_iterator)(str->d).ptr;
  lVar1 = (str->d).size * 2;
  do {
    lVar3 = lVar1;
    local_48.e = local_48.i;
    if (lVar3 == 0) goto LAB_0011d089;
    lVar1 = lVar3 + -2;
  } while ((*(ushort *)((long)&local_48.i[-1].ucs + lVar3) & 0xfc00) == 0xd800);
  local_48.e = (const_iterator)((long)&(local_48.i)->ucs + lVar3);
LAB_0011d089:
  local_48.pos = local_48.i;
  do {
    if (local_48.e <= local_48.pos) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&str->d);
      goto LAB_0011d0fd;
    }
    ucs4 = QStringIterator::next(&local_48,L'�');
    pPVar2 = qGetProp(ucs4);
  } while ((ushort)pPVar2->cases[which] < 2);
  QStringIterator::recede(&local_48);
  it.pos = local_48.pos;
  it.i = local_48.i;
  it.e = local_48.e;
  detachAndConvertCase<QString>(__return_storage_ptr__,str,it,which);
LAB_0011d0fd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QString convertCase(T &str, QUnicodeTables::Case which)
{
    const QChar *p = str.constBegin();
    const QChar *e = p + str.size();

    // this avoids out of bounds check in the loop
    while (e != p && e[-1].isHighSurrogate())
        --e;

    QStringIterator it(p, e);
    while (it.hasNext()) {
        const char32_t uc = it.next();
        if (qGetProp(uc)->cases[which].diff) {
            it.recede();
            return detachAndConvertCase(str, it, which);
        }
    }
    return std::move(str);
}